

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

int __thiscall
QFragmentMapData<QTextBlockData>::length(QFragmentMapData<QTextBlockData> *this,uint field)

{
  uint uVar1;
  uint node;
  uint uVar2;
  int iVar3;
  undefined4 in_ESI;
  QFragmentMapData<QTextBlockData> *in_RDI;
  uint root;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar1 = QFragmentMapData<QTextBlockData>::root(in_RDI);
  if (uVar1 == 0) {
    iVar3 = 0;
  }
  else {
    node = sizeLeft((QFragmentMapData<QTextBlockData> *)
                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    uVar2 = size((QFragmentMapData<QTextBlockData> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),node,
                 in_stack_ffffffffffffffd8);
    iVar3 = node + uVar2;
    uVar1 = sizeRight((QFragmentMapData<QTextBlockData> *)CONCAT44(in_ESI,uVar1),
                      (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
    iVar3 = iVar3 + uVar1;
  }
  return iVar3;
}

Assistant:

int QFragmentMapData<Fragment>::length(uint field) const {
    uint root = this->root();
    return root ? sizeLeft(root, field) + size(root, field) + sizeRight(root, field) : 0;
}